

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btJacobianEntry.h
# Opt level: O1

void __thiscall
btJacobianEntry::btJacobianEntry
          (btJacobianEntry *this,btMatrix3x3 *world2A,btMatrix3x3 *world2B,btVector3 *rel_pos1,
          btVector3 *rel_pos2,btVector3 *jointAxis,btVector3 *inertiaInvA,btScalar massInvA,
          btVector3 *inertiaInvB,btScalar massInvB)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar6 = *(undefined8 *)(jointAxis->m_floats + 2);
  *(undefined8 *)(this->m_linearJointAxis).m_floats = *(undefined8 *)jointAxis->m_floats;
  *(undefined8 *)((this->m_linearJointAxis).m_floats + 2) = uVar6;
  fVar7 = (this->m_linearJointAxis).m_floats[2];
  fVar1 = (this->m_linearJointAxis).m_floats[0];
  fVar11 = (this->m_linearJointAxis).m_floats[1];
  fVar10 = rel_pos1->m_floats[1] * fVar7 - fVar11 * rel_pos1->m_floats[2];
  fVar13 = rel_pos1->m_floats[2] * fVar1 - fVar7 * rel_pos1->m_floats[0];
  fVar12 = rel_pos1->m_floats[0] * fVar11 - fVar1 * rel_pos1->m_floats[1];
  fVar8 = fVar12 * world2A->m_el[0].m_floats[2] +
          fVar10 * world2A->m_el[0].m_floats[0] + fVar13 * world2A->m_el[0].m_floats[1];
  fVar9 = fVar12 * world2A->m_el[1].m_floats[2] +
          fVar10 * world2A->m_el[1].m_floats[0] + fVar13 * world2A->m_el[1].m_floats[1];
  auVar4._4_4_ = fVar9;
  auVar4._0_4_ = fVar8;
  auVar4._8_4_ = fVar12 * world2A->m_el[2].m_floats[2] +
                 fVar10 * world2A->m_el[2].m_floats[0] + fVar13 * world2A->m_el[2].m_floats[1];
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_aJ).m_floats = auVar4;
  fVar13 = fVar11 * rel_pos2->m_floats[2] - rel_pos2->m_floats[1] * fVar7;
  fVar10 = fVar7 * rel_pos2->m_floats[0] - rel_pos2->m_floats[2] * fVar1;
  fVar7 = fVar1 * rel_pos2->m_floats[1] - rel_pos2->m_floats[0] * fVar11;
  fVar11 = fVar7 * world2B->m_el[0].m_floats[2] +
           fVar13 * world2B->m_el[0].m_floats[0] + fVar10 * world2B->m_el[0].m_floats[1];
  fVar12 = fVar7 * world2B->m_el[1].m_floats[2] +
           fVar13 * world2B->m_el[1].m_floats[0] + fVar10 * world2B->m_el[1].m_floats[1];
  auVar2._4_4_ = fVar12;
  auVar2._0_4_ = fVar11;
  auVar2._8_4_ = fVar7 * world2B->m_el[2].m_floats[2] +
                 fVar13 * world2B->m_el[2].m_floats[0] + fVar10 * world2B->m_el[2].m_floats[1];
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_bJ).m_floats = auVar2;
  fVar7 = (this->m_aJ).m_floats[2];
  auVar3._4_4_ = (float)((ulong)*(undefined8 *)inertiaInvA->m_floats >> 0x20) * fVar9;
  auVar3._0_4_ = (float)*(undefined8 *)inertiaInvA->m_floats * fVar8;
  auVar3._8_4_ = inertiaInvA->m_floats[2] * fVar7;
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_0MinvJt).m_floats = auVar3;
  fVar1 = (this->m_bJ).m_floats[2];
  auVar5._4_4_ = (float)((ulong)*(undefined8 *)inertiaInvB->m_floats >> 0x20) * fVar12;
  auVar5._0_4_ = (float)*(undefined8 *)inertiaInvB->m_floats * fVar11;
  auVar5._8_4_ = inertiaInvB->m_floats[2] * fVar1;
  auVar5._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_1MinvJt).m_floats = auVar5;
  this->m_Adiag =
       fVar1 * (this->m_1MinvJt).m_floats[2] +
       fVar11 * (this->m_1MinvJt).m_floats[0] + fVar12 * (this->m_1MinvJt).m_floats[1] +
       fVar7 * (this->m_0MinvJt).m_floats[2] +
       fVar8 * (this->m_0MinvJt).m_floats[0] + fVar9 * (this->m_0MinvJt).m_floats[1] + massInvA +
       massInvB;
  return;
}

Assistant:

btJacobianEntry(
		const btMatrix3x3& world2A,
		const btMatrix3x3& world2B,
		const btVector3& rel_pos1,const btVector3& rel_pos2,
		const btVector3& jointAxis,
		const btVector3& inertiaInvA, 
		const btScalar massInvA,
		const btVector3& inertiaInvB,
		const btScalar massInvB)
		:m_linearJointAxis(jointAxis)
	{
		m_aJ = world2A*(rel_pos1.cross(m_linearJointAxis));
		m_bJ = world2B*(rel_pos2.cross(-m_linearJointAxis));
		m_0MinvJt	= inertiaInvA * m_aJ;
		m_1MinvJt = inertiaInvB * m_bJ;
		m_Adiag = massInvA + m_0MinvJt.dot(m_aJ) + massInvB + m_1MinvJt.dot(m_bJ);

		btAssert(m_Adiag > btScalar(0.0));
	}